

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> * __thiscall
dg::vr::StructureAnalyzer::getRelevantConditions
          (vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>
           *__return_storage_ptr__,StructureAnalyzer *this,VRAssumeBool *assume)

{
  pointer ppPVar1;
  pointer ppVVar2;
  PHINode *pPVar3;
  Value *pVVar4;
  vector<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> result;
  PHINode *phi;
  ICmpInst *icmp;
  vector<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> to_process;
  _Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_> local_98;
  VRAssumeBool *local_80;
  StructureAnalyzer *local_78;
  PHINode *local_70;
  PHINode *local_68;
  _Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> local_60;
  _Vector_base<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_> local_48;
  
  local_60._M_impl.super__Vector_impl_data._M_start = (pointer)(assume->super_VRAssume).val;
  local_78 = this;
  if ((Value *)local_60._M_impl.super__Vector_impl_data._M_start == (Value *)0x0 ||
      *(Value *)((long)local_60._M_impl.super__Vector_impl_data._M_start + 0x10) != (Value)0x50) {
    if ((Value *)local_60._M_impl.super__Vector_impl_data._M_start == (Value *)0x0 ||
        *(Value *)((long)local_60._M_impl.super__Vector_impl_data._M_start + 0x10) != (Value)0x52) {
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    }
    else {
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>>::
      _M_range_initialize<llvm::PHINode_const*const*>
                ((vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>> *)&local_48,
                 &local_60);
      local_80 = assume;
      while( true ) {
        if (local_48._M_impl.super__Vector_impl_data._M_start ==
            local_48._M_impl.super__Vector_impl_data._M_finish) break;
        ppPVar1 = local_48._M_impl.super__Vector_impl_data._M_finish + -1;
        local_48._M_impl.super__Vector_impl_data._M_finish =
             local_48._M_impl.super__Vector_impl_data._M_finish + -1;
        possibleSources((vector<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_> *)
                        &local_60,local_78,*ppPVar1,local_80->assumption);
        ppVVar2 = local_60._M_impl.super__Vector_impl_data._M_finish;
        for (pVVar4 = (Value *)local_60._M_impl.super__Vector_impl_data._M_start;
            pVVar4 != (Value *)ppVVar2; pVVar4 = pVVar4 + 8) {
          pPVar3 = *(PHINode **)(*(long *)(*(long *)pVVar4 + 0x10) + 0x10);
          local_68 = pPVar3;
          if (pPVar3[0x10] != (PHINode)0x50) {
            local_68 = (PHINode *)0x0;
          }
          if (local_68 == (PHINode *)0x0) {
            if (pPVar3[0x10] != (PHINode)0x52) {
              pPVar3 = (PHINode *)0x0;
            }
            local_70 = pPVar3;
            if (pPVar3 == (PHINode *)0x0) {
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__return_storage_ptr__->
              super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::_Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::
              ~_Vector_base(&local_60);
              goto LAB_0013c5e1;
            }
            std::vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>>::
            emplace_back<llvm::PHINode_const*&>
                      ((vector<llvm::PHINode_const*,std::allocator<llvm::PHINode_const*>> *)
                       &local_48,&local_70);
          }
          else {
            std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
            emplace_back<llvm::ICmpInst_const*&>
                      ((vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>> *)
                       &local_98,(ICmpInst **)&local_68);
          }
        }
        std::_Vector_base<const_dg::vr::VREdge_*,_std::allocator<const_dg::vr::VREdge_*>_>::
        ~_Vector_base(&local_60);
      }
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_start = local_98._M_impl.super__Vector_impl_data._M_start;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = local_98._M_impl.super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->
      super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_98._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0013c5e1:
      std::_Vector_base<const_llvm::PHINode_*,_std::allocator<const_llvm::PHINode_*>_>::
      ~_Vector_base(&local_48);
      std::_Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>::
      ~_Vector_base(&local_98);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::ICmpInst_*,_std::allocator<const_llvm::ICmpInst_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_60._M_impl.super__Vector_impl_data._M_start;
    std::vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>>::
    _M_range_initialize<llvm::ICmpInst_const*const*>
              ((vector<llvm::ICmpInst_const*,std::allocator<llvm::ICmpInst_const*>> *)
               __return_storage_ptr__,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<const llvm::ICmpInst *>
StructureAnalyzer::getRelevantConditions(const VRAssumeBool *assume) const {
    if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(assume->getValue()))
        return {icmp};

    const auto *phi = llvm::dyn_cast<llvm::PHINode>(assume->getValue());
    if (!phi)
        return {};

    std::vector<const llvm::ICmpInst *> result;
    std::vector<const llvm::PHINode *> to_process{phi};

    while (!to_process.empty()) {
        const auto *phi = to_process.back();
        to_process.pop_back();

        for (const auto *sourceEdge :
             possibleSources(phi, assume->getAssumption())) {
            assert(sourceEdge->op->isInstruction());
            const llvm::Instruction *inst =
                    static_cast<const VRInstruction *>(sourceEdge->op.get())
                            ->getInstruction();
            if (const auto *icmp = llvm::dyn_cast<llvm::ICmpInst>(inst))
                result.emplace_back(icmp);
            else if (const auto *phi = llvm::dyn_cast<llvm::PHINode>(inst))
                to_process.emplace_back(phi);
            else
                return {};
        }
    }
    return result;
}